

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

bool __thiscall minihttp::TcpSocket::update(TcpSocket *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *__buf;
  ssize_t sVar5;
  int *piVar6;
  size_t __n;
  
  iVar3 = (*this->_vptr_TcpSocket[8])();
  if (((char)iVar3 == '\0') || (lVar1 = this->_s, lVar1 == -1)) {
LAB_00106dc1:
    bVar2 = false;
  }
  else {
    if (this->_inbuf == (char *)0x0) {
      if (this->_inbufSize == 0x1000) {
        __buf = (char *)0x0;
      }
      else {
        __buf = (char *)malloc(0x1000);
        this->_inbuf = __buf;
      }
      this->_inbufSize = 0x1000;
      this->_writeSize = 0xfff;
      this->_writeptr = __buf;
      this->_readptr = __buf;
      __n = 0xfff;
    }
    else {
      __buf = this->_writeptr;
      __n = (size_t)this->_writeSize;
    }
    sVar5 = recv((int)lVar1,__buf,__n,0);
    iVar3 = (int)__buf;
    uVar4 = (uint)sVar5;
    if ((int)uVar4 < 1) {
      if ((uVar4 == 0xffffffff) && (piVar6 = __errno_location(), *piVar6 == 0xb)) goto LAB_00106dc1;
      close(this,iVar3);
    }
    else {
      this->_inbuf[uVar4 & 0x7fffffff] = '\0';
      this->_recvSize = uVar4;
      this->_writeSize = this->_inbufSize - 1;
      this->_writeptr = this->_inbuf;
      this->_readptr = this->_inbuf;
      (*this->_vptr_TcpSocket[4])(this);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool TcpSocket::update(void)
{
   if(!_OnUpdate())
       return false;

   if(!isOpen())
       return false;

    if(!_inbuf)
        SetBufsizeIn(DEFAULT_BUFSIZE);

    int bytes = _readBytes((unsigned char*)_writeptr, _writeSize);
    //traceprint("TcpSocket::update: _readBytes() result %d\n", bytes);
    if(bytes > 0) // we received something
    {
        _inbuf[bytes] = 0;
        _recvSize = bytes;

        // reset pointers for next read
        _writeSize = _inbufSize - 1;
        _readptr = _writeptr = _inbuf;

        _OnData();
    }
    else if(bytes == 0) // remote has closed the connection
    {
        close();
    }
    else // whoops, error?
    {
        // Possible that the error is returned directly (in that case, < -1, or -1 is returned and the error has to be retrieved seperately.
        // But in the latter case, error numbers may be positive (at least on windows...)
        int err = bytes == -1 ? _GetError() : bytes;
        switch(err)
        {
        case EWOULDBLOCK:
#if defined(EAGAIN) && (EWOULDBLOCK != EAGAIN)
        case EAGAIN: // linux man pages say this can also happen instead of EWOULDBLOCK
#endif
            return false;

#ifdef MINIHTTP_USE_MBEDTLS
        case MBEDTLS_ERR_SSL_WANT_READ:
            break; // Try again later
#endif

        default:
            traceprint("SOCKET UPDATE ERROR: (%d): %s\n", err, _GetErrorStr(err).c_str());
        case ECONNRESET:
        case ENOTCONN:
        case ETIMEDOUT:
#ifdef _WIN32
        case WSAECONNABORTED:
        case WSAESHUTDOWN:
#endif
            close();
            break;
        }
    }
    return true;
}